

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O3

bool duckdb::TrySimpleIntegerCast<unsigned_int,false>(char *buf,idx_t len,uint *result,bool strict)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  byte bVar7;
  ushort uVar8;
  duckdb *pdVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  byte bVar17;
  byte bVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int16_t local_5a;
  IntegerDecimalCastData<unsigned_int> local_58;
  ulong local_40;
  ulong local_38;
  
  if (len == 0) {
    return false;
  }
  uVar3 = 0;
  do {
    bVar17 = buf[uVar3];
    if ((4 < bVar17 - 9) && (bVar17 != 0x20)) {
      if (bVar17 == 0x2d) {
        uVar12 = len - uVar3;
        uVar10 = 1;
        goto LAB_017e5f97;
      }
      if (bVar17 == 0x30 && len - 1 != uVar3) {
        bVar18 = buf[uVar3 + 1];
        if (bVar18 < 0x62) {
          if (bVar18 == 0x42) {
LAB_017e6258:
            uVar10 = ~uVar3 + len;
            if (1 < uVar10) {
              uVar14 = 0;
              uVar12 = 1;
              goto LAB_017e6273;
            }
            break;
          }
          if (bVar18 == 0x58) {
LAB_017e6143:
            uVar10 = ~uVar3 + len;
            if (1 < uVar10) {
              uVar14 = 0;
              uVar12 = 1;
              goto LAB_017e6168;
            }
            break;
          }
        }
        else {
          if (bVar18 == 0x62) goto LAB_017e6258;
          if (bVar18 == 0x78) goto LAB_017e6143;
        }
      }
      uVar12 = len - uVar3;
      uVar10 = (ulong)(bVar17 == 0x2b);
      if (uVar12 <= uVar10) {
        uVar14 = 0;
        uVar20 = 1;
        goto LAB_017e6373;
      }
      uVar14 = 0;
      uVar6 = uVar10;
      goto LAB_017e600b;
    }
    uVar3 = uVar3 + 1;
  } while (len != uVar3);
  goto LAB_017e6430;
  while (lVar4 = uVar3 + uVar10, uVar10 = uVar10 + 1, buf[lVar4] == '0') {
LAB_017e5f97:
    if (uVar12 <= uVar10) {
      if (len - 1 != uVar3) {
        uVar14 = 0;
        uVar10 = 1;
        goto LAB_017e60ad;
      }
      break;
    }
  }
  goto LAB_017e6430;
  while( true ) {
    uVar14 = uVar14 * 10 - (uint)(byte)(bVar17 - 0x30);
    uVar20 = uVar12;
    if (~uVar10 + len == uVar3) break;
    if (buf[uVar3 + 1 + uVar10] == '_') {
      if (((len - uVar10) - 2 == uVar3) ||
         (uVar20 = uVar10 + 2, 9 < (byte)(buf[uVar3 + uVar20] - 0x30U))) goto LAB_017e6430;
    }
    else {
      uVar20 = uVar10 + 1;
    }
    uVar10 = uVar20;
    if (uVar12 <= uVar20) break;
LAB_017e60ad:
    bVar17 = buf[uVar3 + uVar10];
    if (9 < (byte)(bVar17 - 0x30)) {
      uVar6 = uVar10;
      if (bVar17 == 0x2e) {
        uVar6 = uVar10 + 1;
        if (uVar12 <= uVar6) {
          if (uVar10 < 2) goto LAB_017e6430;
          goto LAB_017e63f4;
        }
        if ((uVar10 < 2) || (bVar17 = buf[uVar3 + 1 + uVar10], (byte)(bVar17 - 0x30) < 10))
        goto LAB_017e6430;
      }
      if ((4 < bVar17 - 9) && (bVar17 != 0x20)) goto LAB_017e6430;
      uVar6 = uVar6 + 1;
      uVar20 = uVar6;
      if (uVar6 < uVar12) goto LAB_017e63c6;
      break;
    }
  }
  goto LAB_017e63ee;
  while (uVar6 = uVar6 + 1, uVar20 = uVar12, uVar12 != uVar6) {
LAB_017e63c6:
    if ((4 < (byte)buf[uVar3 + uVar6] - 9) && (buf[uVar3 + uVar6] != 0x20)) goto LAB_017e6430;
  }
LAB_017e63ee:
  if (1 < uVar20) goto LAB_017e63f4;
  goto LAB_017e6430;
  while( true ) {
    uVar6 = uVar10;
    if ((len - uVar12) - 2 != uVar3) {
      if (buf[uVar3 + 2 + uVar12] == '_') {
        if (((len - uVar12) - 3 == uVar3) || ((buf[uVar3 + 3 + uVar12] & 0xfeU) != 0x30))
        goto LAB_017e6430;
        uVar6 = uVar12 + 2;
      }
      else {
        uVar6 = uVar12 + 1;
      }
    }
    uVar12 = uVar6;
    if ((int)uVar14 < 0) goto LAB_017e6430;
    uVar14 = iVar11 + uVar14 * 2;
    if (uVar10 <= uVar12) break;
LAB_017e6273:
    iVar11 = 0;
    if (buf[uVar3 + 1 + uVar12] != '0') {
      if (buf[uVar3 + 1 + uVar12] != '1') goto LAB_017e6430;
      iVar11 = 1;
    }
  }
  goto LAB_017e63f4;
  while( true ) {
    uVar12 = uVar6;
    if (~(uint)bVar7 >> 4 < uVar14) goto LAB_017e6430;
    uVar14 = uVar14 * 0x10 + (uint)bVar7;
    if (uVar10 <= uVar12) break;
LAB_017e6168:
    bVar17 = buf[uVar3 + 1 + uVar12];
    bVar18 = bVar17 | 0x20;
    if (0x19 < (byte)(bVar17 + 0xbf)) {
      bVar18 = bVar17;
    }
    bVar17 = bVar18 - 0x30;
    if ((byte)(bVar18 + 0x9f) < 6 || bVar17 < 10) {
      bVar7 = bVar18 + 0xa9;
      if (bVar18 < 0x61) {
        bVar7 = bVar17;
      }
    }
    else {
      bVar7 = bVar17;
      if (5 < (byte)(bVar18 + 0xbf)) goto LAB_017e6430;
    }
    uVar6 = uVar10;
    if ((len - uVar12) - 2 != uVar3) {
      if (buf[uVar3 + 2 + uVar12] == '_') {
        if ((len - uVar12) - 3 == uVar3) goto LAB_017e6430;
        uVar6 = uVar12 + 2;
        if ((9 < (byte)(buf[uVar3 + 3 + uVar12] - 0x30U)) &&
           ((uVar13 = (byte)buf[uVar3 + 3 + uVar12] - 0x41, 0x25 < uVar13 ||
            ((0x3f0000003fU >> ((ulong)uVar13 & 0x3f) & 1) == 0)))) goto LAB_017e6430;
      }
      else {
        uVar6 = uVar12 + 1;
      }
    }
  }
  goto LAB_017e63f4;
  while( true ) {
    if (~(uint)bVar18 / 10 < uVar14) goto LAB_017e6430;
    uVar14 = (uint)bVar18 + uVar14 * 10;
    uVar20 = uVar12;
    if (~uVar6 + len == uVar3) break;
    if (buf[uVar3 + 1 + uVar6] == '_') {
      if (((len - uVar6) - 2 == uVar3) ||
         (uVar6 = uVar6 + 2, 9 < (byte)(buf[uVar3 + uVar6] - 0x30U))) goto LAB_017e6430;
    }
    else {
      uVar6 = uVar6 + 1;
    }
    uVar20 = uVar6;
    if (uVar12 <= uVar6) break;
LAB_017e600b:
    bVar17 = buf[uVar3 + uVar6];
    bVar18 = bVar17 - 0x30;
    if (9 < bVar18) {
      uVar20 = uVar6;
      if (bVar17 == 0x2e) {
        uVar20 = uVar6 + 1;
        if (uVar12 <= uVar20) {
          if (uVar6 <= uVar10) goto LAB_017e6430;
          break;
        }
        if ((uVar6 <= uVar10) || (bVar17 = buf[uVar3 + 1 + uVar6], (byte)(bVar17 - 0x30) < 10))
        goto LAB_017e6430;
      }
      if ((4 < bVar17 - 9) && (bVar17 != 0x20)) goto LAB_017e6430;
      uVar6 = uVar20 + 1;
      uVar20 = uVar6;
      if (uVar6 < uVar12) goto LAB_017e6348;
      break;
    }
  }
  goto LAB_017e6373;
LAB_017e6878:
  uVar15 = uVar16;
  bVar17 = buf[uVar3 + uVar20];
  bVar18 = bVar17 - 0x30;
  local_38 = uVar19;
  if (9 < bVar18) {
    local_58._16_8_ = uVar15 & 0xffff;
    if (uVar20 <= uVar19 && uVar6 <= uVar12) {
      return false;
    }
LAB_017e6a86:
    uVar14 = (uint)bVar17;
    if (bVar17 < 0x20) {
      if (4 < uVar14 - 9) {
        return false;
      }
LAB_017e6a9c:
      uVar20 = uVar20 + 1;
      uVar21 = uVar20;
      if (uVar20 < uVar10) {
        do {
          if ((4 < (byte)buf[uVar3 + uVar20] - 9) && (buf[uVar3 + uVar20] != 0x20)) {
            return false;
          }
          uVar20 = uVar20 + 1;
          uVar21 = uVar10;
        } while (uVar10 != uVar20);
      }
      goto LAB_017e6942;
    }
    if ((bVar17 != 0x65) && (uVar14 != 0x45)) {
      if (uVar14 != 0x20) {
        return false;
      }
      goto LAB_017e6a9c;
    }
    if (uVar20 == uVar12) {
      return false;
    }
    if (uVar10 <= uVar20 + 1) {
      return false;
    }
    local_5a = 0;
    pdVar9 = (duckdb *)(buf + uVar3 + uVar20 + 1);
    pcVar5 = (char *)(~uVar3 + (len - uVar20));
    if (*pdVar9 == (duckdb)0x2d) {
      bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pdVar9,pcVar5,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar5,bVar2);
    }
    else {
      bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pdVar9,pcVar5,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar5,bVar2);
    }
    if (bVar2 == false) {
      return false;
    }
    bVar2 = IntegerDecimalCastOperation::
            HandleExponent<duckdb::IntegerDecimalCastData<unsigned_int>,false>(&local_58,local_5a);
    goto LAB_017e6824;
  }
  uVar16 = uVar15;
  if (local_58.decimal <= (long)(((ulong)bVar18 ^ 0x7ffffffffffffffe) / 10)) {
    uVar14 = uVar14 + 1;
    local_58.decimal = local_58.decimal * 10 + (ulong)bVar18;
    uVar16 = (ulong)uVar14;
  }
  uVar21 = uVar10;
  local_40 = uVar15;
  if (~uVar20 + len != uVar3) goto code_r0x017e68e6;
  goto LAB_017e6b35;
code_r0x017e68e6:
  if (buf[uVar3 + 1 + uVar20] == '_') {
    if ((len - uVar20) - 2 == uVar3) {
      return false;
    }
    uVar20 = uVar20 + 2;
    if (9 < (byte)(buf[uVar3 + uVar20] - 0x30U)) {
      return false;
    }
  }
  else {
    uVar20 = uVar20 + 1;
  }
  uVar21 = uVar20;
  if (uVar10 <= uVar20) goto LAB_017e6b35;
  goto LAB_017e6878;
LAB_017e6b35:
  local_58._16_8_ = uVar16 & 0xffff;
LAB_017e6b45:
  if ((uVar6 <= uVar12) && (uVar21 <= uVar19)) {
    return false;
  }
  goto LAB_017e6942;
LAB_017e6996:
  bVar17 = buf[uVar3 + uVar6];
  bVar18 = bVar17 - 0x30;
  local_40 = uVar20;
  if (9 < bVar18) {
    local_58._18_6_ = 0;
    if (uVar6 <= uVar20 && uVar12 < 2) {
      return false;
    }
LAB_017e6b80:
    uVar14 = (uint)bVar17;
    if (0x1f < bVar17) {
      if ((bVar17 != 0x65) && (uVar14 != 0x45)) {
        if (uVar14 != 0x20) {
          return false;
        }
        goto LAB_017e6b96;
      }
      if (uVar6 == 1) {
        return false;
      }
      if (uVar10 <= uVar6 + 1) {
        return false;
      }
      local_5a = 0;
      pdVar9 = (duckdb *)(buf + uVar3 + uVar6 + 1);
      pcVar5 = (char *)(~uVar3 + (len - uVar6));
      if (*pdVar9 == (duckdb)0x2d) {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                          (pdVar9,pcVar5,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar5,bVar2);
      }
      else {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          (pdVar9,pcVar5,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar5,bVar2);
      }
      if (bVar2 == false) {
        return false;
      }
      bVar2 = IntegerDecimalCastOperation::
              HandleExponent<duckdb::IntegerDecimalCastData<unsigned_int>,true>(&local_58,local_5a);
      goto LAB_017e6824;
    }
    if (4 < uVar14 - 9) {
      return false;
    }
LAB_017e6b96:
    uVar6 = uVar6 + 1;
    uVar19 = uVar6;
    if (uVar6 < uVar10) {
      do {
        if ((4 < (byte)buf[uVar3 + uVar6] - 9) && (buf[uVar3 + uVar6] != 0x20)) {
          return false;
        }
        uVar6 = uVar6 + 1;
        uVar19 = uVar10;
      } while (uVar10 != uVar6);
    }
    goto LAB_017e6a36;
  }
  if (local_58.decimal <= (long)(((ulong)bVar18 ^ 0x7ffffffffffffffe) / 10)) {
    local_58.decimal_digits = uVar8 + 1;
    local_58.decimal = (ulong)bVar18 + local_58.decimal * 10;
    uVar8 = local_58.decimal_digits;
  }
  uVar19 = uVar10;
  if (~uVar6 + len != uVar3) goto code_r0x017e69e9;
  goto LAB_017e6c29;
code_r0x017e69e9:
  if (buf[uVar3 + 1 + uVar6] == '_') {
    if ((len - uVar6) - 2 == uVar3) {
      return false;
    }
    uVar6 = uVar6 + 2;
    if (9 < (byte)(buf[uVar3 + uVar6] - 0x30U)) {
      return false;
    }
  }
  else {
    uVar6 = uVar6 + 1;
  }
  uVar19 = uVar6;
  if (uVar10 <= uVar6) goto LAB_017e6c29;
  goto LAB_017e6996;
LAB_017e6c29:
  local_58._18_6_ = 0;
LAB_017e6c39:
  if ((uVar12 < 2) && (uVar19 <= uVar20)) {
    return false;
  }
  goto LAB_017e6a36;
  while (uVar6 = uVar6 + 1, uVar20 = uVar12, uVar12 != uVar6) {
LAB_017e6348:
    if ((4 < (byte)buf[uVar3 + uVar6] - 9) && (buf[uVar3 + uVar6] != 0x20)) goto LAB_017e6430;
  }
LAB_017e6373:
  if (uVar10 < uVar20) {
LAB_017e63f4:
    *result = uVar14;
    return true;
  }
LAB_017e6430:
  uVar3 = 0;
  while ((bVar17 = buf[uVar3], bVar17 - 9 < 5 || (bVar17 == 0x20))) {
    uVar3 = uVar3 + 1;
    if (len == uVar3) {
      return false;
    }
  }
  local_58.result = 0;
  local_58.decimal = 0;
  local_58._16_8_ = 0;
  uVar10 = len - uVar3;
  bVar2 = SUB81(uVar10,0);
  if (bVar17 == 0x2d) {
    lVar4 = 1;
    while (uVar10 + (uVar10 == 0) != lVar4) {
      lVar1 = uVar3 + lVar4;
      lVar4 = lVar4 + 1;
      if (buf[lVar1] != '0') {
        return false;
      }
    }
    if (len - 1 == uVar3) {
      IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,true>
                (&local_58);
      return false;
    }
    uVar12 = 1;
    local_58.result = 0;
    do {
      bVar17 = buf[uVar3 + uVar12];
      bVar18 = bVar17 - 0x30;
      if (9 < bVar18) {
        uVar6 = uVar12;
        if (bVar17 != 0x2e) goto LAB_017e6b80;
        uVar20 = uVar12 + 1;
        uVar19 = uVar20;
        if (uVar10 <= uVar20) goto LAB_017e6c39;
        local_58.decimal = 0;
        local_58.decimal_digits = 0;
        uVar8 = 0;
        uVar6 = uVar20;
        goto LAB_017e6996;
      }
      uVar6 = (0x8000000000000000 - (ulong)bVar18) / 10;
      if (SBORROW8(local_58.result,-uVar6) != (long)(local_58.result + uVar6) < 0) {
        return false;
      }
      local_58.result = local_58.result * 10 - (ulong)bVar18;
      uVar19 = uVar10;
      if (~uVar12 + len == uVar3) break;
      if (buf[uVar3 + 1 + uVar12] == '_') {
        if ((len - uVar12) - 2 == uVar3) {
          return false;
        }
        uVar12 = uVar12 + 2;
        if (9 < (byte)(buf[uVar3 + uVar12] - 0x30U)) {
          return false;
        }
      }
      else {
        uVar12 = uVar12 + 1;
      }
      uVar19 = uVar12;
    } while (uVar12 < uVar10);
LAB_017e6a36:
    bVar2 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,true>
                      (&local_58);
    if (!bVar2) {
      return false;
    }
    if (uVar19 < 2) {
      return false;
    }
    goto LAB_017e6a56;
  }
  if (bVar17 == 0x30 && len - 1 != uVar3) {
    bVar18 = buf[uVar3 + 1];
    if (bVar18 < 0x62) {
      if (bVar18 == 0x42) {
LAB_017e6787:
        uVar10 = ~uVar3 + len;
        if (uVar10 < 2) goto LAB_017e682d;
        uVar12 = 1;
        local_58.result = 0;
        do {
          lVar4 = 0;
          if (buf[uVar3 + 1 + uVar12] != '0') {
            if (buf[uVar3 + 1 + uVar12] != '1') {
              return false;
            }
            lVar4 = 1;
          }
          uVar6 = uVar10;
          if ((len - uVar12) - 2 != uVar3) {
            if (buf[uVar3 + 2 + uVar12] == '_') {
              if ((len - uVar12) - 3 == uVar3) {
                return false;
              }
              if ((buf[uVar3 + 3 + uVar12] & 0xfeU) != 0x30) {
                return false;
              }
              uVar6 = uVar12 + 2;
            }
            else {
              uVar6 = uVar12 + 1;
            }
          }
          uVar12 = uVar6;
          if (0x3fffffffffffffff < local_58.result) {
            return false;
          }
          local_58.result = lVar4 + local_58.result * 2;
        } while (uVar12 < uVar10);
      }
      else {
        if (bVar18 != 0x58) goto LAB_017e64d3;
LAB_017e6666:
        uVar10 = ~uVar3 + len;
        if (uVar10 < 2) goto LAB_017e682d;
        uVar12 = 1;
        local_58.result = 0;
        do {
          bVar17 = buf[uVar3 + 1 + uVar12];
          bVar18 = bVar17 | 0x20;
          if (0x19 < (byte)(bVar17 + 0xbf)) {
            bVar18 = bVar17;
          }
          bVar17 = bVar18 - 0x30;
          if ((byte)(bVar18 + 0x9f) < 6 || bVar17 < 10) {
            bVar7 = bVar18 + 0xa9;
            if (bVar18 < 0x61) {
              bVar7 = bVar17;
            }
          }
          else {
            bVar7 = bVar17;
            if (5 < (byte)(bVar18 + 0xbf)) {
              return false;
            }
          }
          uVar6 = uVar10;
          if ((len - uVar12) - 2 != uVar3) {
            if (buf[uVar3 + 2 + uVar12] == '_') {
              if ((len - uVar12) - 3 == uVar3) {
                return false;
              }
              uVar6 = uVar12 + 2;
              if (9 < (byte)(buf[uVar3 + 3 + uVar12] - 0x30U)) {
                uVar14 = (byte)buf[uVar3 + 3 + uVar12] - 0x41;
                if (0x25 < uVar14) {
                  return false;
                }
                if ((0x3f0000003fU >> ((ulong)uVar14 & 0x3f) & 1) == 0) {
                  return false;
                }
              }
            }
            else {
              uVar6 = uVar12 + 1;
            }
          }
          uVar12 = uVar6;
          if ((long)((ulong)(bVar7 >> 4) ^ 0x7ffffffffffffff) < local_58.result) {
            return false;
          }
          local_58.result = local_58.result * 0x10 + (ulong)bVar7;
        } while (uVar12 < uVar10);
      }
      bVar2 = IntegerDecimalCastOperation::
              Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>(&local_58);
LAB_017e6824:
      if (bVar2 == false) {
        return false;
      }
      goto LAB_017e6a56;
    }
    if (bVar18 == 0x62) goto LAB_017e6787;
    if (bVar18 == 0x78) goto LAB_017e6666;
  }
LAB_017e64d3:
  uVar12 = (ulong)(bVar17 == 0x2b);
  if (uVar10 <= uVar12) {
LAB_017e682d:
    IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>
              (&local_58);
    return false;
  }
  local_58.result = 0;
  uVar6 = uVar12;
  do {
    bVar17 = buf[uVar3 + uVar6];
    bVar18 = bVar17 - 0x30;
    if (9 < bVar18) {
      uVar20 = uVar6;
      if (bVar17 != 0x2e) goto LAB_017e6a86;
      uVar19 = uVar6 + 1;
      uVar21 = uVar19;
      if (uVar10 <= uVar19) goto LAB_017e6b45;
      local_58.decimal = 0;
      uVar14 = 0;
      uVar16 = 0;
      uVar20 = uVar19;
      goto LAB_017e6878;
    }
    if ((long)(((ulong)bVar18 ^ 0x7ffffffffffffffe) / 10) < local_58.result) {
      return false;
    }
    local_58.result = local_58.result * 10 + (ulong)bVar18;
    uVar21 = uVar10;
    if (~uVar6 + len == uVar3) break;
    if (buf[uVar3 + 1 + uVar6] == '_') {
      if ((len - uVar6) - 2 == uVar3) {
        return false;
      }
      uVar6 = uVar6 + 2;
      if (9 < (byte)(buf[uVar3 + uVar6] - 0x30U)) {
        return false;
      }
    }
    else {
      uVar6 = uVar6 + 1;
    }
    uVar21 = uVar6;
  } while (uVar6 < uVar10);
LAB_017e6942:
  bVar2 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>
                    (&local_58);
  if (!bVar2) {
    return false;
  }
  if (uVar21 <= uVar12) {
    return false;
  }
LAB_017e6a56:
  *result = (uint)local_58.result;
  return true;
}

Assistant:

static bool TryIntegerCast(const char *buf, idx_t len, T &result, bool strict) {
	// skip any spaces at the start
	while (len > 0 && StringUtil::CharacterIsSpace(*buf)) {
		buf++;
		len--;
	}
	if (len == 0) {
		return false;
	}
	if (ZERO_INITIALIZE) {
		memset(&result, 0, sizeof(T));
	}
	// if the number is negative, we set the negative flag and skip the negative sign
	if (*buf == '-') {
		if (!IS_SIGNED) {
			// Need to check if its not -0
			idx_t pos = 1;
			while (pos < len) {
				if (buf[pos++] != '0') {
					return false;
				}
			}
		}
		return IntegerCastLoop<T, true, ALLOW_EXPONENT, OP, decimal_separator>(buf, len, result, strict);
	}
	if (len > 1 && *buf == '0') {
		if (buf[1] == 'x' || buf[1] == 'X') {
			// If it starts with 0x or 0X, we parse it as a hex value
			buf++;
			len--;
			return IntegerHexCastLoop<T, false, false, OP>(buf, len, result, strict);
		} else if (buf[1] == 'b' || buf[1] == 'B') {
			// If it starts with 0b or 0B, we parse it as a binary value
			buf++;
			len--;
			return IntegerBinaryCastLoop<T, false, false, OP>(buf, len, result, strict);
		} else if (strict && StringUtil::CharacterIsDigit(buf[1])) {
			// leading zeros are not allowed in strict mode
			return false;
		}
	}
	return IntegerCastLoop<T, false, ALLOW_EXPONENT, OP, decimal_separator>(buf, len, result, strict);
}